

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void RunLoadStorePropagation(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  uint *optCount;
  VmInstructionType cmd;
  VmBlock *pVVar1;
  VariableData *pVVar2;
  VmBlock *pVVar3;
  long *plVar4;
  VmValue **ppVVar5;
  LoadStoreInfo *pLVar6;
  VmValue **ppVVar7;
  VmValueType VVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  SmallArray<VmModule::LoadStoreInfo,_32U> *this;
  TypeBase *pTVar13;
  VmValue *pVVar14;
  VmConstant *pVVar15;
  VmInstruction *pVVar16;
  undefined4 extraout_var;
  VmValue *pVVar17;
  VmValue *pVVar18;
  VmValue *pVVar19;
  VmInstruction *pVVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  char *pcVar24;
  VmInstructionType VVar25;
  long lVar26;
  ulong uVar27;
  VmInstruction *pVVar28;
  ulong uVar29;
  SynBase *pSVar30;
  VmConstant *pVVar31;
  VmModule *pVVar32;
  Allocator *pAVar33;
  VmConstant *this_00;
  long lVar34;
  long lVar35;
  ulong uVar36;
  long lVar37;
  VmFunction *pVVar38;
  VmConstant *pVVar39;
  VmInstruction *pVVar40;
  bool bVar41;
  VmType type;
  VmType type_00;
  SmallArray<VmInstruction_*,_32U> deadStores;
  VmModule *pVVar42;
  VmConstant *local_158;
  undefined1 local_148 [272];
  Allocator *local_38;
  undefined4 extraout_var_00;
  
  if ((value == (VmValue *)0x0) || (pVVar38 = (VmFunction *)value, value->typeID != 4)) {
    pVVar38 = (VmFunction *)0x0;
  }
  if (pVVar38 == (VmFunction *)0x0) {
    if ((value == (VmValue *)0x0) || (value->typeID != 3)) {
      value = (VmValue *)0x0;
    }
    if ((VmBlock *)value != (VmBlock *)0x0) {
      (module->loadStoreInfo).count = 0;
      if (((VmBlock *)value)->firstInstruction != (VmInstruction *)0x0) {
        optCount = &module->loadStorePropagations;
        this = &module->loadStoreInfo;
        pVVar28 = ((VmBlock *)value)->firstInstruction;
        pVVar32 = module;
        do {
          pVVar40 = pVVar28->nextSibling;
          module = pVVar32;
          switch(pVVar28->cmd) {
          case VM_INST_LOAD_BYTE:
            pVVar14 = anon_unknown.dwarf_233176::GetLoadStoreInfo(pVVar32,pVVar28);
            if ((pVVar14 == (VmValue *)0x0) || (pVVar14->typeID != 1)) goto LAB_0028ae57;
            pAVar33 = pVVar32->allocator;
            pSVar30 = pVVar14->source;
            iVar10 = (int)*(char *)&pVVar14[1]._vptr_VmValue;
LAB_0028ae37:
            pVVar15 = CreateConstantInt(pAVar33,pSVar30,iVar10);
            anon_unknown.dwarf_233176::ReplaceValueUsersWith
                      (pVVar32,&pVVar28->super_VmValue,&pVVar15->super_VmValue,optCount);
            break;
          case VM_INST_LOAD_SHORT:
            pVVar14 = anon_unknown.dwarf_233176::GetLoadStoreInfo(pVVar32,pVVar28);
            if ((pVVar14 != (VmValue *)0x0) && (pVVar14->typeID == 1)) {
              pAVar33 = pVVar32->allocator;
              pSVar30 = pVVar14->source;
              iVar10 = (int)*(short *)&pVVar14[1]._vptr_VmValue;
              goto LAB_0028ae37;
            }
            goto LAB_0028ae57;
          case VM_INST_LOAD_INT:
          case VM_INST_LOAD_FLOAT:
          case VM_INST_LOAD_DOUBLE:
          case VM_INST_LOAD_LONG:
          case VM_INST_LOAD_STRUCT:
            pVVar16 = (VmInstruction *)anon_unknown.dwarf_233176::GetLoadStoreInfo(pVVar32,pVVar28);
            module = pVVar32;
            if (pVVar16 != (VmInstruction *)0x0) {
              pVVar42 = pVVar32;
              if (((pVVar28->super_VmValue).type.type != (pVVar16->super_VmValue).type.type) ||
                 (pVVar20 = pVVar16,
                 (pVVar28->super_VmValue).type.size != (pVVar16->super_VmValue).type.size)) {
                if ((pVVar28->super_VmValue).type.size != (pVVar16->super_VmValue).type.size) {
                  __assert_fail("curr->type.size == prevValue->type.size",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                                ,0x14f9,
                                "void RunLoadStorePropagation(ExpressionContext &, VmModule *, VmValue *)"
                               );
                }
                pVVar32->currentBlock = (VmBlock *)value;
                ((VmBlock *)value)->insertPoint = pVVar28->prevSibling;
                type.structType = (TypeBase *)0x4e;
                type._0_8_ = (pVVar28->super_VmValue).type.structType;
                pVVar20 = anon_unknown.dwarf_233176::CreateInstruction
                                    ((anon_unknown_dwarf_233176 *)pVVar32,
                                     (VmModule *)(pVVar28->super_VmValue).source,
                                     *(SynBase **)&(pVVar28->super_VmValue).type,type,
                                     (VmInstructionType)pVVar16,(VmValue *)0x0,(VmValue *)0x0,
                                     (VmValue *)0x0,(VmValue *)0x0,(VmValue *)pVVar32);
                ((VmBlock *)value)->insertPoint = ((VmBlock *)value)->lastInstruction;
                pVVar32->currentBlock = (VmBlock *)0x0;
              }
              anon_unknown.dwarf_233176::ReplaceValueUsersWith
                        (pVVar32,&pVVar28->super_VmValue,&pVVar20->super_VmValue,optCount);
              pVVar32 = pVVar42;
              module = pVVar32;
              if (pVVar16 != (VmInstruction *)0x0) break;
            }
LAB_0028ae57:
            anon_unknown.dwarf_233176::AddLoadInfo(pVVar32,pVVar28);
            break;
          case VM_INST_STORE_BYTE:
          case VM_INST_STORE_SHORT:
          case VM_INST_STORE_INT:
          case VM_INST_STORE_FLOAT:
          case VM_INST_STORE_DOUBLE:
          case VM_INST_STORE_LONG:
          case VM_INST_STORE_STRUCT:
            uVar11 = (pVVar28->arguments).count;
            if ((uVar11 == 0) || (uVar11 == 1)) goto LAB_0028b7f4;
            ppVVar7 = (pVVar28->arguments).data;
            pVVar14 = ppVVar7[1];
            if ((pVVar14 == (VmValue *)0x0) || (pVVar14->typeID != 1)) {
              pVVar14 = (VmValue *)0x0;
            }
            pVVar15 = (VmConstant *)*ppVVar7;
            if ((pVVar15 == (VmConstant *)0x0) ||
               (pVVar31 = pVVar15, (pVVar15->super_VmValue).typeID != 1)) {
              pVVar31 = (VmConstant *)0x0;
            }
            if (pVVar31 == (VmConstant *)0x0) {
              if ((pVVar15 == (VmConstant *)0x0) || ((pVVar15->super_VmValue).typeID != 2)) {
                pVVar15 = (VmConstant *)0x0;
              }
              if ((pVVar15 != (VmConstant *)0x0) && (pVVar15->iValue == 0x16)) {
                uVar11 = (uint)pVVar15->lValue;
                if (uVar11 == 0) goto LAB_0028b7f4;
                plVar4 = (long *)pVVar15->dValue;
                lVar26 = *plVar4;
                if ((lVar26 == 0) || (*(int *)(lVar26 + 8) != 1)) {
                  lVar26 = 0;
                }
                if (uVar11 == 1) goto LAB_0028b7f4;
                lVar37 = plVar4[1];
                if ((lVar37 == 0) || (*(int *)(lVar37 + 8) != 1)) {
                  lVar37 = 0;
                }
                if ((lVar26 == 0) || (lVar37 == 0)) {
                  __assert_fail("length && elemSize",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                                ,0x5f4,
                                "void (anonymous namespace)::AddStoreInfo(VmModule *, VmInstruction *)"
                               );
                }
                if (uVar11 < 3) goto LAB_0028b7f4;
                lVar34 = plVar4[2];
                if ((lVar34 == 0) || (*(int *)(lVar34 + 8) != 1)) {
                  lVar34 = 0;
                }
                if (lVar34 != 0) {
                  if (uVar11 != 3) {
                    lVar35 = plVar4[3];
                    if ((lVar35 == 0) || (*(int *)(lVar35 + 8) != 1)) {
                      lVar35 = 0;
                    }
                    iVar10 = *(int *)(lVar34 + 0x98);
                    iVar21 = *(int *)(lVar37 + 0x98);
                    if (lVar35 == 0) {
                      iVar21 = iVar21 * *(int *)(lVar26 + 0x98);
                    }
                    else {
                      iVar10 = iVar10 + *(int *)(lVar35 + 0x98) * iVar21;
                    }
                    anon_unknown.dwarf_233176::ClearLoadStoreInfo
                              (pVVar32,*(VariableData **)(lVar34 + 200),
                               iVar10 + *(int *)&pVVar14[1]._vptr_VmValue,
                               iVar21 - *(int *)&pVVar14[1]._vptr_VmValue);
                    module = pVVar32;
                    break;
                  }
                  goto LAB_0028b7f4;
                }
              }
LAB_0028b35c:
              anon_unknown.dwarf_233176::ClearLoadStoreInfoAliasing(module,pVVar28);
            }
            else if (pVVar31->container != (VariableData *)0x0) {
              if (*(int *)&pVVar14[1]._vptr_VmValue != 0) {
                __assert_fail("storeOffset->iValue == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                              ,0x5d1,
                              "void (anonymous namespace)::AddStoreInfo(VmModule *, VmInstruction *)"
                             );
              }
              pTVar13 = pVVar31->container->type;
              if ((pTVar13 == (TypeBase *)0x0) || (pTVar13->typeID != 0x13)) {
                pTVar13 = (TypeBase *)0x0;
              }
              if ((pTVar13 == (TypeBase *)0x0) ||
                 (lVar26._0_4_ = pTVar13[1].typeID, lVar26._4_4_ = pTVar13[1].nameHash,
                 lVar26 < 0x21)) {
                uVar11 = GetAccessSize(pVVar28);
                anon_unknown.dwarf_233176::ClearLoadStoreInfo
                          (pVVar32,pVVar31->container,pVVar31->iValue,uVar11);
                if (pVVar31->container == (VariableData *)0x0) {
                  bVar9 = false;
                }
                else {
                  bVar9 = HasAddressTaken(pVVar31->container);
                  bVar9 = !bVar9;
                }
                uVar12 = (pVVar32->loadStoreInfo).count;
                if (uVar12 == (pVVar32->loadStoreInfo).max) {
                  SmallArray<VmModule::LoadStoreInfo,_32U>::grow(this,uVar12);
                }
                pLVar6 = this->data;
                if (pLVar6 == (LoadStoreInfo *)0x0) goto LAB_0028b8ae;
                uVar12 = (pVVar32->loadStoreInfo).count;
                (pVVar32->loadStoreInfo).count = uVar12 + 1;
                pLVar6[uVar12].loadInst = (VmInstruction *)0x0;
                pLVar6[uVar12].storeInst = pVVar28;
                pLVar6[uVar12].copyInst = (VmInstruction *)0x0;
                pLVar6[uVar12].accessSize = uVar11;
                pLVar6[uVar12].loadAddress = (VmConstant *)0x0;
                (&pLVar6[uVar12].loadAddress)[1] = (VmConstant *)0x0;
                pLVar6[uVar12].loadOffset = (VmConstant *)0x0;
                pLVar6[uVar12].storeAddress = pVVar31;
                pLVar6[uVar12].storePointer = (VmValue *)0x0;
                (&pLVar6[uVar12].storePointer)[1] = (VmValue *)0x0;
                pLVar6[uVar12].noLoadOrNoContainerAlias = true;
                pLVar6[uVar12].noStoreOrNoContainerAlias = bVar9;
                module = pVVar32;
              }
            }
            break;
          case VM_INST_SET_RANGE:
switchD_0028a882_caseD_1a:
            module = pVVar32;
            anon_unknown.dwarf_233176::ClearLoadStoreInfoAliasing(pVVar32,(VmInstruction *)0x0);
            anon_unknown.dwarf_233176::ClearLoadStoreInfoGlobal(pVVar32);
            break;
          case VM_INST_MEM_COPY:
            uVar11 = (pVVar28->arguments).count;
            if ((uVar11 < 3) || (uVar11 == 3)) goto LAB_0028b7f4;
            ppVVar7 = (pVVar28->arguments).data;
            pVVar15 = (VmConstant *)ppVVar7[3];
            if ((pVVar15 == (VmConstant *)0x0) || ((pVVar15->super_VmValue).typeID != 1)) {
              pVVar15 = (VmConstant *)0x0;
            }
            pVVar14 = ppVVar7[2];
            uVar11 = GetAccessSize(pVVar28);
            pVVar16 = anon_unknown.dwarf_233176::GetCopyInfo(pVVar32,pVVar14,pVVar15,uVar11);
            if (pVVar16 != (VmInstruction *)0x0) {
              uVar11 = (pVVar28->arguments).count;
              if ((((uVar11 == 0) || (uVar11 == 1)) ||
                  (uVar12 = (pVVar16->arguments).count, uVar12 < 3)) ||
                 ((uVar12 == 3 || (uVar11 < 5)))) goto LAB_0028b7f4;
              ppVVar7 = (pVVar28->arguments).data;
              ppVVar5 = (pVVar16->arguments).data;
              anon_unknown.dwarf_233176::ChangeInstructionTo
                        (pVVar32,pVVar28,pVVar28->cmd,*ppVVar7,ppVVar7[1],ppVVar5[2],ppVVar5[3],
                         ppVVar7[4],optCount);
            }
            uVar11 = (pVVar28->arguments).count;
            if ((uVar11 == 0) || (uVar11 == 1)) goto LAB_0028b7f4;
            ppVVar7 = (pVVar28->arguments).data;
            pVVar14 = ppVVar7[1];
            if ((pVVar14 == (VmValue *)0x0) || (pVVar14->typeID != 1)) {
              pVVar14 = (VmValue *)0x0;
            }
            pVVar15 = (VmConstant *)*ppVVar7;
            if ((pVVar15 == (VmConstant *)0x0) || ((pVVar15->super_VmValue).typeID != 1)) {
              pVVar15 = (VmConstant *)0x0;
            }
            if (pVVar15 == (VmConstant *)0x0) goto LAB_0028b35c;
            if (pVVar15->container != (VariableData *)0x0) {
              if (*(int *)&pVVar14[1]._vptr_VmValue != 0) {
                __assert_fail("storeOffset->iValue == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                              ,0x617,
                              "void (anonymous namespace)::AddCopyInfo(VmModule *, VmInstruction *)"
                             );
              }
              uVar12 = GetAccessSize(pVVar28);
              uVar11 = (pVVar28->arguments).count;
              if ((uVar11 < 3) || (uVar11 == 3)) goto LAB_0028b7f4;
              ppVVar7 = (pVVar28->arguments).data;
              local_158 = (VmConstant *)ppVVar7[3];
              if ((local_158 == (VmConstant *)0x0) || ((local_158->super_VmValue).typeID != 1)) {
                local_158 = (VmConstant *)0x0;
              }
              pVVar31 = (VmConstant *)ppVVar7[2];
              if ((pVVar31 == (VmConstant *)0x0) ||
                 (pVVar39 = pVVar31, (pVVar31->super_VmValue).typeID != 1)) {
                pVVar39 = (VmConstant *)0x0;
              }
              if (pVVar39 == (VmConstant *)0x0) {
                pVVar39 = (VmConstant *)0x0;
              }
              else {
                if (*(int *)&pVVar14[1]._vptr_VmValue != 0) {
                  __assert_fail("storeOffset->iValue == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                                ,0x627,
                                "void (anonymous namespace)::AddCopyInfo(VmModule *, VmInstruction *)"
                               );
                }
                local_158 = (VmConstant *)0x0;
                pVVar31 = (VmConstant *)0x0;
              }
              anon_unknown.dwarf_233176::ClearLoadStoreInfo
                        (module,pVVar15->container,pVVar15->iValue,uVar12);
              bVar9 = pVVar39 == (VmConstant *)0x0 && pVVar31 == (VmConstant *)0x0;
              if (pVVar39 != (VmConstant *)0x0) {
                if (pVVar39->container == (VariableData *)0x0) {
                  bVar9 = false;
                }
                else {
                  bVar9 = HasAddressTaken(pVVar39->container);
                  bVar9 = !bVar9;
                }
              }
              if (pVVar15->container == (VariableData *)0x0) {
                bVar41 = false;
              }
              else {
                bVar41 = HasAddressTaken(pVVar15->container);
                bVar41 = !bVar41;
              }
              uVar11 = (module->loadStoreInfo).count;
              if (uVar11 == (module->loadStoreInfo).max) {
                SmallArray<VmModule::LoadStoreInfo,_32U>::grow(this,uVar11);
              }
              pLVar6 = this->data;
              if (pLVar6 == (LoadStoreInfo *)0x0) {
LAB_0028b8ae:
                pcVar24 = 
                "void SmallArray<VmModule::LoadStoreInfo, 32>::push_back(const T &) [T = VmModule::LoadStoreInfo, N = 32]"
                ;
LAB_0028b847:
                __assert_fail("data",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                              ,0x162,pcVar24);
              }
              uVar11 = (module->loadStoreInfo).count;
              (module->loadStoreInfo).count = uVar11 + 1;
              pLVar6[uVar11].loadInst = (VmInstruction *)0x0;
              pLVar6[uVar11].storeInst = (VmInstruction *)0x0;
              pLVar6[uVar11].copyInst = pVVar28;
              pLVar6[uVar11].accessSize = uVar12;
              pLVar6[uVar11].loadAddress = pVVar39;
              pLVar6[uVar11].loadPointer = &pVVar31->super_VmValue;
              pLVar6[uVar11].loadOffset = local_158;
              pLVar6[uVar11].storeAddress = pVVar15;
              pLVar6[uVar11].storePointer = (VmValue *)0x0;
              (&pLVar6[uVar11].storePointer)[1] = (VmValue *)0x0;
              pLVar6[uVar11].noLoadOrNoContainerAlias = bVar9;
              pLVar6[uVar11].noStoreOrNoContainerAlias = bVar41;
            }
            break;
          case VM_INST_CALL:
            uVar11 = (pVVar28->arguments).count;
            if (uVar11 == 0) goto LAB_0028b7f4;
            ppVVar7 = (pVVar28->arguments).data;
            if (((*ppVVar7)->type).type == VM_TYPE_FUNCTION_REF) {
              uVar11 = 2;
              pVVar14 = (VmValue *)0x0;
            }
            else {
              if (uVar11 == 1) goto LAB_0028b7f4;
              pVVar14 = ppVVar7[1];
              if ((pVVar14 == (VmValue *)0x0) || (uVar11 = 3, pVVar14->typeID != 4)) {
                uVar11 = 3;
                pVVar14 = (VmValue *)0x0;
              }
            }
            uVar12 = (pVVar28->arguments).count;
            if (uVar11 < uVar12) {
              uVar23 = (ulong)uVar11;
              do {
                pVVar18 = (pVVar28->arguments).data[uVar23];
                if ((pVVar18 == (VmValue *)0x0) || (pVVar18->typeID != 1)) {
                  pVVar18 = (VmValue *)0x0;
                }
                if (((pVVar18 != (VmValue *)0x0) && (pVVar18[1].hasMemoryAccess == true)) &&
                   (pVVar16 = anon_unknown.dwarf_233176::GetCopyInfo
                                        (pVVar32,pVVar18,(VmConstant *)0x0,(pVVar18->type).size),
                   pVVar16 != (VmInstruction *)0x0)) {
                  if ((pVVar16->arguments).count < 3) goto LAB_0028b7f4;
                  pVVar19 = (pVVar16->arguments).data[2];
                  if ((pVVar19 == (VmValue *)0x0) || (pVVar19->typeID != 1)) {
                    pVVar19 = (VmValue *)0x0;
                  }
                  if (pVVar19 != (VmValue *)0x0) {
                    iVar10 = (*pVVar32->allocator->_vptr_Allocator[2])(pVVar32->allocator,0xd8);
                    pVVar17 = (VmValue *)CONCAT44(extraout_var_00,iVar10);
                    pAVar33 = ctx->allocator;
                    VVar8 = (pVVar18->type).type;
                    uVar12 = (pVVar18->type).size;
                    pTVar13 = (pVVar18->type).structType;
                    pSVar30 = (pVVar28->super_VmValue).source;
                    pVVar17->typeID = 1;
                    (pVVar17->type).type = VVar8;
                    (pVVar17->type).size = uVar12;
                    (pVVar17->type).structType = pTVar13;
                    pVVar17->source = pSVar30;
                    (pVVar17->comment).begin = (char *)0x0;
                    (pVVar17->comment).end = (char *)0x0;
                    (pVVar17->users).allocator = pAVar33;
                    (pVVar17->users).data = (pVVar17->users).little;
                    (pVVar17->users).count = 0;
                    (pVVar17->users).max = 8;
                    pVVar17->hasSideEffects = false;
                    pVVar17->hasMemoryAccess = false;
                    pVVar17->canBeRemoved = true;
                    pVVar17->hasKnownSimpleUse = false;
                    pVVar17->hasKnownNonSimpleUse = false;
                    pVVar17->_vptr_VmValue = (_func_int **)&PTR__VmValue_003f8d38;
                    *(undefined4 *)&pVVar17[1]._vptr_VmValue = 0;
                    *(undefined8 *)&pVVar17[1].typeID = 0;
                    pVVar17[1].type.type = VM_TYPE_VOID;
                    pVVar17[1].type.size = 0;
                    pVVar17[1].type.structType = (TypeBase *)0x0;
                    pVVar17[1].source = (SynBase *)0x0;
                    pVVar17[1].comment.begin = (char *)0x0;
                    pVVar17[1].comment.end = (char *)0x0;
                    pVVar17[1].hasSideEffects = false;
                    pVVar17[1].hasMemoryAccess = false;
                    *(undefined4 *)&pVVar17[1]._vptr_VmValue =
                         *(undefined4 *)&pVVar19[1]._vptr_VmValue;
                    pcVar24 = pVVar19[1].comment.end;
                    pVVar17[1].comment.end = pcVar24;
                    pVVar17[1].hasMemoryAccess = true;
                    if (*(uint *)(pcVar24 + 0x50) == *(uint *)(pcVar24 + 0x54)) {
                      SmallArray<VmConstant_*,_8U>::grow
                                ((SmallArray<VmConstant_*,_8U> *)(pcVar24 + 0x48),
                                 *(uint *)(pcVar24 + 0x50));
                    }
                    lVar26 = (long)((SmallArray<VmConstant_*,_8U> *)(pcVar24 + 0x48))->data;
                    if (lVar26 == 0) {
                      pcVar24 = 
                      "void SmallArray<VmConstant *, 8>::push_back(const T &) [T = VmConstant *, N = 8]"
                      ;
                      goto LAB_0028b847;
                    }
                    uVar12 = *(uint *)(pcVar24 + 0x50);
                    *(uint *)(pcVar24 + 0x50) = uVar12 + 1;
                    *(VmValue **)(lVar26 + (ulong)uVar12 * 8) = pVVar17;
                    pcVar24 = (pVVar18->comment).end;
                    (pVVar17->comment).begin = (pVVar18->comment).begin;
                    (pVVar17->comment).end = pcVar24;
                    VmValue::AddUse(pVVar17,&pVVar28->super_VmValue);
                    if (((pVVar28->arguments).count <= uVar23) ||
                       (VmValue::RemoveUse((pVVar28->arguments).data[uVar23],&pVVar28->super_VmValue
                                          ), (pVVar28->arguments).count <= uVar23))
                    goto LAB_0028b7f4;
                    (pVVar28->arguments).data[uVar23] = pVVar17;
                  }
                }
                uVar23 = uVar23 + 1;
                uVar12 = (pVVar28->arguments).count;
              } while (uVar23 < uVar12);
            }
            if (uVar12 <= uVar11 - 1) goto LAB_0028b7f4;
            pVVar18 = (pVVar28->arguments).data[uVar11 - 1];
            if ((pVVar18 == (VmValue *)0x0) || (pVVar18->typeID != 1)) {
              pVVar18 = (VmValue *)0x0;
            }
            if ((pVVar18 != (VmValue *)0x0) && (pVVar18[1].hasMemoryAccess == true)) {
              anon_unknown.dwarf_233176::ClearLoadStoreInfo
                        (pVVar32,(VariableData *)pVVar18[1].comment.end,
                         *(uint *)&pVVar18[1]._vptr_VmValue,(pVVar18->type).size);
            }
            if ((pVVar14 == (VmValue *)0x0) ||
               (module = pVVar32, (*(byte *)((long)pVVar14[1]._vptr_VmValue + 0x14) & 1) == 0))
            goto switchD_0028a882_caseD_1a;
            break;
          case VM_INST_RETURN:
            if ((pVVar28->arguments).count != 0) {
              pVVar14 = *(pVVar28->arguments).data;
              if ((pVVar14 == (VmValue *)0x0) || (pVVar14->typeID != 1)) {
                pVVar14 = (VmValue *)0x0;
              }
              if (((pVVar14 != (VmValue *)0x0) && (pVVar14[1].hasMemoryAccess == true)) &&
                 (pVVar16 = anon_unknown.dwarf_233176::GetCopyInfo
                                      (pVVar32,pVVar14,(VmConstant *)0x0,(pVVar14->type).size),
                 module = pVVar32, pVVar16 != (VmInstruction *)0x0)) {
                if (2 < (pVVar16->arguments).count) {
                  pVVar18 = (pVVar16->arguments).data[2];
                  if ((pVVar18 == (VmValue *)0x0) || (pVVar18->typeID != 1)) {
                    pVVar18 = (VmValue *)0x0;
                  }
                  if (pVVar18 == (VmValue *)0x0) break;
                  iVar10 = (*pVVar32->allocator->_vptr_Allocator[2])(pVVar32->allocator,0xd8);
                  local_148._0_8_ = CONCAT44(extraout_var,iVar10);
                  pAVar33 = ctx->allocator;
                  VVar8 = (pVVar14->type).type;
                  uVar11 = (pVVar14->type).size;
                  pTVar13 = (pVVar14->type).structType;
                  pSVar30 = (pVVar28->super_VmValue).source;
                  (((VmConstant *)local_148._0_8_)->super_VmValue).typeID = 1;
                  (((VmConstant *)local_148._0_8_)->super_VmValue).type.type = VVar8;
                  (((VmConstant *)local_148._0_8_)->super_VmValue).type.size = uVar11;
                  (((VmConstant *)local_148._0_8_)->super_VmValue).type.structType = pTVar13;
                  (((VmConstant *)local_148._0_8_)->super_VmValue).source = pSVar30;
                  (((VmConstant *)local_148._0_8_)->super_VmValue).comment.begin = (char *)0x0;
                  (((VmConstant *)local_148._0_8_)->super_VmValue).comment.end = (char *)0x0;
                  (((VmConstant *)local_148._0_8_)->super_VmValue).users.allocator = pAVar33;
                  (((VmConstant *)local_148._0_8_)->super_VmValue).users.data =
                       (((VmConstant *)local_148._0_8_)->super_VmValue).users.little;
                  (((VmConstant *)local_148._0_8_)->super_VmValue).users.count = 0;
                  (((VmConstant *)local_148._0_8_)->super_VmValue).users.max = 8;
                  (((VmConstant *)local_148._0_8_)->super_VmValue).hasSideEffects = false;
                  (((VmConstant *)local_148._0_8_)->super_VmValue).hasMemoryAccess = false;
                  (((VmConstant *)local_148._0_8_)->super_VmValue).canBeRemoved = true;
                  (((VmConstant *)local_148._0_8_)->super_VmValue).hasKnownSimpleUse = false;
                  (((VmConstant *)local_148._0_8_)->super_VmValue).hasKnownNonSimpleUse = false;
                  (((VmConstant *)local_148._0_8_)->super_VmValue)._vptr_VmValue =
                       (_func_int **)&PTR__VmValue_003f8d38;
                  ((VmConstant *)local_148._0_8_)->iValue = 0;
                  ((VmConstant *)local_148._0_8_)->dValue = 0.0;
                  ((VmConstant *)local_148._0_8_)->lValue = 0;
                  ((VmConstant *)local_148._0_8_)->sValue = (char *)0x0;
                  ((VmConstant *)local_148._0_8_)->bValue = (VmBlock *)0x0;
                  ((VmConstant *)local_148._0_8_)->fValue = (VmFunction *)0x0;
                  ((VmConstant *)local_148._0_8_)->container = (VariableData *)0x0;
                  ((VmConstant *)local_148._0_8_)->isFloat = false;
                  ((VmConstant *)local_148._0_8_)->isReference = false;
                  ((VmConstant *)local_148._0_8_)->iValue = *(int *)&pVVar18[1]._vptr_VmValue;
                  pVVar2 = (VariableData *)pVVar18[1].comment.end;
                  ((VmConstant *)local_148._0_8_)->container = pVVar2;
                  ((VmConstant *)local_148._0_8_)->isReference = true;
                  SmallArray<VmConstant_*,_8U>::push_back(&pVVar2->users,(VmConstant **)local_148);
                  VVar25 = pVVar28->cmd;
                  pVVar14 = (VmValue *)0x0;
                  pVVar15 = (VmConstant *)local_148._0_8_;
                  goto LAB_0028aa47;
                }
                goto LAB_0028b7f4;
              }
            }
            break;
          case VM_INST_ADD_LOAD:
          case VM_INST_SUB_LOAD:
          case VM_INST_MUL_LOAD:
          case VM_INST_DIV_LOAD:
          case VM_INST_POW_LOAD:
          case VM_INST_MOD_LOAD:
          case VM_INST_LESS_LOAD:
          case VM_INST_GREATER_LOAD:
          case VM_INST_LESS_EQUAL_LOAD:
          case VM_INST_GREATER_EQUAL_LOAD:
          case VM_INST_EQUAL_LOAD:
          case VM_INST_NOT_EQUAL_LOAD:
          case VM_INST_SHL_LOAD:
          case VM_INST_SHR_LOAD:
          case VM_INST_BIT_AND_LOAD:
          case VM_INST_BIT_OR_LOAD:
          case VM_INST_BIT_XOR_LOAD:
            uVar11 = (pVVar28->arguments).count;
            if ((uVar11 < 2) || (uVar11 == 2)) goto LAB_0028b7f4;
            ppVVar7 = (pVVar28->arguments).data;
            pVVar15 = (VmConstant *)ppVVar7[2];
            if ((pVVar15 == (VmConstant *)0x0) || ((pVVar15->super_VmValue).typeID != 1)) {
              pVVar15 = (VmConstant *)0x0;
            }
            if (uVar11 < 4) goto LAB_0028b7f4;
            pVVar14 = ppVVar7[3];
            iVar10 = *(int *)&pVVar14[1]._vptr_VmValue;
            if (iVar10 - 4U < 2) {
              uVar11 = 8;
LAB_0028a9c3:
              bVar9 = false;
            }
            else {
              if (iVar10 - 2U < 2) {
                uVar11 = 4;
                goto LAB_0028a9c3;
              }
              uVar11 = 0;
              bVar9 = true;
            }
            if (bVar9) {
              __assert_fail("loadSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x15aa,
                            "void RunLoadStorePropagation(ExpressionContext &, VmModule *, VmValue *)"
                           );
            }
            pVVar18 = ppVVar7[1];
            uVar12 = GetAccessSize(pVVar28);
            pVVar14 = anon_unknown.dwarf_233176::GetLoadStoreInfo
                                (pVVar32,pVVar18,pVVar15,uVar11,uVar12,
                                 *(VmInstructionType *)&pVVar14[1]._vptr_VmValue);
            module = pVVar32;
            if (pVVar14 != (VmValue *)0x0) {
              if (0x10 < pVVar28->cmd - VM_INST_ADD_LOAD) {
                __assert_fail("!\"unknown operation\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                              ,0x10d,
                              "VmInstructionType (anonymous namespace)::GetOperationWithoutLoad(VmInstructionType)"
                             );
              }
              if ((pVVar28->arguments).count == 0) goto LAB_0028b7f4;
              VVar25 = pVVar28->cmd - VM_INST_DOUBLE_TO_FLOAT;
              pVVar15 = (VmConstant *)*(pVVar28->arguments).data;
LAB_0028aa47:
              anon_unknown.dwarf_233176::ChangeInstructionTo
                        (pVVar32,pVVar28,VVar25,&pVVar15->super_VmValue,pVVar14,(VmValue *)0x0,
                         (VmValue *)0x0,(VmValue *)0x0,optCount);
            }
          }
          pVVar28 = pVVar40;
          pVVar32 = module;
        } while (pVVar40 != (VmInstruction *)0x0);
      }
      pVVar32 = module;
      for (pVVar28 = ((VmBlock *)value)->firstInstruction; pVVar28 != (VmInstruction *)0x0;
          pVVar28 = pVVar28->nextSibling) {
        VVar25 = pVVar28->cmd;
        pVVar40 = pVVar28;
        if (VVar25 - VM_INST_STORE_BYTE < 7) {
          do {
            pVVar40 = pVVar40->prevSibling;
            if (pVVar40 == (VmInstruction *)0x0) goto LAB_0028b5ad;
            cmd = pVVar40->cmd;
            bVar9 = anon_unknown.dwarf_233176::HasMemoryAccess(cmd);
          } while (!bVar9);
          if (cmd == VVar25) {
            uVar11 = (pVVar40->arguments).count;
            if (uVar11 == 0) goto LAB_0028b7f4;
            ppVVar7 = (pVVar40->arguments).data;
            pVVar15 = (VmConstant *)*ppVVar7;
            if ((pVVar15 == (VmConstant *)0x0) ||
               (pVVar31 = pVVar15, (pVVar15->super_VmValue).typeID != 1)) {
              pVVar31 = (VmConstant *)0x0;
            }
            if (uVar11 == 1) goto LAB_0028b7f4;
            pVVar14 = ppVVar7[1];
            if ((pVVar14 == (VmValue *)0x0) || (pVVar14->typeID != 1)) {
              pVVar14 = (VmValue *)0x0;
            }
            uVar11 = (pVVar28->arguments).count;
            if (uVar11 == 0) goto LAB_0028b7f4;
            ppVVar7 = (pVVar28->arguments).data;
            pVVar39 = (VmConstant *)*ppVVar7;
            if ((pVVar39 == (VmConstant *)0x0) ||
               (this_00 = pVVar39, (pVVar39->super_VmValue).typeID != 1)) {
              this_00 = (VmConstant *)0x0;
            }
            if (uVar11 == 1) goto LAB_0028b7f4;
            pVVar18 = ppVVar7[1];
            if ((pVVar18 == (VmValue *)0x0) || (pVVar18->typeID != 1)) {
              pVVar18 = (VmValue *)0x0;
            }
            if ((pVVar31 == (VmConstant *)0x0) || (this_00 == (VmConstant *)0x0)) {
              if (pVVar15 == pVVar39) goto LAB_0028b589;
            }
            else {
              bVar9 = VmConstant::operator==(this_00,pVVar31);
              if (bVar9) {
LAB_0028b589:
                if (*(int *)&pVVar14[1]._vptr_VmValue == *(int *)&pVVar18[1]._vptr_VmValue) {
                  VmBlock::RemoveInstruction((VmBlock *)value,pVVar40);
                  module->loadStorePropagations = module->loadStorePropagations + 1;
                }
              }
            }
          }
        }
LAB_0028b5ad:
      }
      pVVar28 = ((VmBlock *)value)->firstInstruction;
      if (pVVar28 != (VmInstruction *)0x0) {
        do {
          pVVar40 = pVVar28->nextSibling;
          pVVar42 = pVVar32;
          if (pVVar28->cmd - VM_INST_LOAD_INT < 5) {
            uVar11 = (pVVar28->arguments).count;
            if ((uVar11 == 0) || (uVar11 == 1)) {
LAB_0028b7f4:
              __assert_fail("index < count",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                            ,0x199,
                            "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                           );
            }
            ppVVar7 = (pVVar28->arguments).data;
            pVVar14 = ppVVar7[1];
            if ((pVVar14 == (VmValue *)0x0) || (pVVar14->typeID != 1)) {
              pVVar14 = (VmValue *)0x0;
            }
            pVVar18 = *ppVVar7;
            if ((pVVar18 == (VmValue *)0x0) || (pVVar19 = pVVar18, pVVar18->typeID != 1)) {
              pVVar19 = (VmValue *)0x0;
            }
            if ((pVVar19 == (VmValue *)0x0) || (pVVar19[1].comment.end != (char *)0x0)) {
              iVar10 = 0;
              bVar9 = true;
            }
            else {
              iVar10 = 0x23;
              bVar9 = false;
              pVVar28 = pVVar40;
            }
            if (bVar9) {
              pVVar16 = pVVar28->prevSibling;
              iVar10 = 0;
              if (pVVar16 != (VmInstruction *)0x0) {
                do {
                  VVar25 = pVVar16->cmd;
                  bVar9 = anon_unknown.dwarf_233176::HasMemoryAccess(VVar25);
                  if (bVar9) {
                    if (VVar25 - VM_INST_STORE_INT < 5) {
                      uVar11 = (pVVar16->arguments).count;
                      if ((uVar11 == 0) || (uVar11 == 1)) goto LAB_0028b7f4;
                      ppVVar7 = (pVVar16->arguments).data;
                      pVVar19 = ppVVar7[1];
                      if ((pVVar19 == (VmValue *)0x0) || (pVVar19->typeID != 1)) {
                        pVVar19 = (VmValue *)0x0;
                      }
                      if (uVar11 < 3) goto LAB_0028b7f4;
                      pVVar17 = *ppVVar7;
                      pVVar20 = (VmInstruction *)ppVVar7[2];
                      uVar11 = GetAccessSize(pVVar16);
                      uVar12 = GetAccessSize(pVVar28);
                      if ((uVar11 == uVar12) && (pVVar17 == pVVar18)) {
                        iVar10 = 0;
                        pVVar42 = pVVar32;
                        if ((*(int *)&pVVar19[1]._vptr_VmValue == *(int *)&pVVar14[1]._vptr_VmValue)
                           && ((pVVar28->super_VmValue).type.size ==
                               (pVVar20->super_VmValue).type.size)) {
                          if (((pVVar28->super_VmValue).type.type !=
                               (pVVar20->super_VmValue).type.type) ||
                             ((pVVar28->super_VmValue).type.size !=
                              (pVVar20->super_VmValue).type.size)) {
                            pVVar32->currentBlock = (VmBlock *)value;
                            ((VmBlock *)value)->insertPoint = pVVar28->prevSibling;
                            type_00.structType = (TypeBase *)0x4e;
                            type_00._0_8_ = (pVVar28->super_VmValue).type.structType;
                            pVVar20 = anon_unknown.dwarf_233176::CreateInstruction
                                                ((anon_unknown_dwarf_233176 *)pVVar32,
                                                 (VmModule *)(pVVar28->super_VmValue).source,
                                                 *(SynBase **)&(pVVar28->super_VmValue).type,type_00
                                                 ,(VmInstructionType)pVVar20,(VmValue *)0x0,
                                                 (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                                                 (VmValue *)pVVar32);
                            ((VmBlock *)value)->insertPoint = ((VmBlock *)value)->lastInstruction;
                            pVVar32->currentBlock = (VmBlock *)0x0;
                          }
                          anon_unknown.dwarf_233176::ReplaceValueUsersWith
                                    (pVVar32,&pVVar28->super_VmValue,&pVVar20->super_VmValue,
                                     &module->loadStorePropagations);
                        }
                        goto LAB_0028b770;
                      }
                    }
                    break;
                  }
                  pVVar16 = pVVar16->prevSibling;
                } while (pVVar16 != (VmInstruction *)0x0);
                iVar10 = 0;
                pVVar42 = pVVar32;
              }
            }
LAB_0028b770:
            if (iVar10 == 0) goto LAB_0028b774;
          }
          else {
LAB_0028b774:
            pVVar28 = pVVar40;
          }
          pVVar32 = pVVar42;
        } while (pVVar28 != (VmInstruction *)0x0);
      }
    }
  }
  else {
    module->currentFunction = pVVar38;
    pVVar3 = pVVar38->firstBlock;
    pVVar32 = module;
    while (pVVar3 != (VmBlock *)0x0) {
      pVVar1 = pVVar3->nextSibling;
      RunLoadStorePropagation(ctx,module,&pVVar3->super_VmValue);
      pVVar3 = pVVar1;
    }
    if ((pVVar38->allocas).count != 0) {
      uVar23 = 0;
      do {
        pVVar2 = (pVVar38->allocas).data[uVar23];
        uVar27 = (ulong)(pVVar2->users).count;
        if (uVar27 == 0) {
          bVar9 = false;
        }
        else {
          uVar29 = 0;
          bVar9 = false;
          do {
            pVVar15 = (pVVar2->users).data[uVar29];
            uVar22 = (ulong)(pVVar15->super_VmValue).users.count;
            if (uVar22 != 0) {
              uVar36 = 1;
              do {
                pVVar14 = (pVVar15->super_VmValue).users.data[uVar36 - 1];
                if ((pVVar14 == (VmValue *)0x0) || (pVVar14->typeID != 2)) {
                  pVVar14 = (VmValue *)0x0;
                }
                if (pVVar14 == (VmValue *)0x0) {
                  __assert_fail("!\"invalid constant use\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                                ,0x14a8,
                                "void RunLoadStorePropagation(ExpressionContext &, VmModule *, VmValue *)"
                               );
                }
                iVar10 = *(int *)&pVVar14[1]._vptr_VmValue;
                if (iVar10 - 8U < 7) {
                  if (pVVar14[1].type.type == VM_TYPE_VOID) goto LAB_0028b7f4;
                  if ((VmConstant *)**(long **)&pVVar14[1].typeID != pVVar15) goto LAB_0028a60b;
LAB_0028a6af:
                  iVar21 = 0xc;
                }
                else {
LAB_0028a60b:
                  if (iVar10 != 0x1b) goto LAB_0028a687;
                  if (pVVar14[1].type.type == VM_TYPE_VOID) goto LAB_0028b7f4;
                  if ((VmConstant *)**(long **)&pVVar14[1].typeID == pVVar15) goto LAB_0028a6af;
                  if (pVVar14[1].type.type < VM_TYPE_LONG) goto LAB_0028b7f4;
                  if ((VmConstant *)(*(long **)&pVVar14[1].typeID)[2] == pVVar15) {
                    lVar26 = **(long **)&pVVar14[1].typeID;
                    if ((lVar26 == 0) || (*(int *)(lVar26 + 8) != 1)) {
                      lVar26 = 0;
                    }
                    if ((lVar26 == 0) || (*(VariableData **)(lVar26 + 200) != pVVar15->container)) {
                      iVar21 = 0;
                      bVar41 = true;
                    }
                    else {
                      iVar21 = 0xc;
                      bVar41 = false;
                    }
                    if (bVar41) goto LAB_0028a687;
                  }
                  else {
LAB_0028a687:
                    if (iVar10 == 0x1a) {
                      if (pVVar14[1].type.type == VM_TYPE_VOID) goto LAB_0028b7f4;
                      if ((VmConstant *)**(long **)&pVVar14[1].typeID == pVVar15) goto LAB_0028a6af;
                    }
                    iVar21 = 10;
                    bVar9 = true;
                  }
                }
              } while ((iVar21 == 0xc) && (bVar41 = uVar36 < uVar22, uVar36 = uVar36 + 1, bVar41));
            }
            uVar29 = uVar29 + 1;
          } while ((uVar29 < uVar27) && (!bVar9));
        }
        if (!bVar9) {
          local_38 = module->allocator;
          local_148._0_8_ = local_148 + 0x10;
          local_148._8_8_ = 0x2000000000;
          module = pVVar32;
          if ((pVVar2->users).count != 0) {
            uVar27 = 0;
            do {
              pVVar15 = (pVVar2->users).data[uVar27];
              if ((pVVar15->super_VmValue).users.count != 0) {
                uVar29 = 0;
                do {
                  pVVar14 = (pVVar15->super_VmValue).users.data[uVar29];
                  if ((pVVar14 == (VmValue *)0x0) || (pVVar14->typeID != 2)) {
                    pVVar14 = (VmValue *)0x0;
                  }
                  if (pVVar14 != (VmValue *)0x0) {
                    if (local_148._8_4_ == local_148._12_4_) {
                      SmallArray<VmInstruction_*,_32U>::grow
                                ((SmallArray<VmInstruction_*,_32U> *)local_148,local_148._8_4_);
                    }
                    if ((VmConstant *)local_148._0_8_ == (VmConstant *)0x0) {
                      pcVar24 = 
                      "void SmallArray<VmInstruction *, 32>::push_back(const T &) [T = VmInstruction *, N = 32]"
                      ;
                      goto LAB_0028b847;
                    }
                    uVar22 = local_148._8_8_ & 0xffffffff;
                    local_148._8_4_ = local_148._8_4_ + 1;
                    (((VmValue *)local_148._0_8_)->users).little[uVar22 - 10] = pVVar14;
                  }
                  uVar29 = uVar29 + 1;
                } while (uVar29 < (pVVar15->super_VmValue).users.count);
              }
              uVar27 = uVar27 + 1;
            } while (uVar27 < (pVVar2->users).count);
          }
          pVVar32 = module;
          if (local_148._8_4_ != 0) {
            uVar27 = 0;
            do {
              pVVar28 = (VmInstruction *)(((VmValue *)local_148._0_8_)->users).little[uVar27 - 10];
              pVVar3 = pVVar28->parent;
              if (pVVar3 != (VmBlock *)0x0) {
                VmBlock::RemoveInstruction(pVVar3,pVVar28);
              }
              module->loadStorePropagations = module->loadStorePropagations + 1;
              uVar27 = uVar27 + 1;
            } while (uVar27 < (local_148._8_8_ & 0xffffffff));
          }
          SmallArray<VmInstruction_*,_32U>::~SmallArray
                    ((SmallArray<VmInstruction_*,_32U> *)local_148);
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 < (pVVar38->allocas).count);
    }
    module->currentFunction = (VmFunction *)0x0;
  }
  return;
}

Assistant:

void RunLoadStorePropagation(ExpressionContext &ctx, VmModule *module, VmValue *value)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		module->currentFunction = function;

		VmBlock *curr = function->firstBlock;

		while(curr)
		{
			VmBlock *next = curr->nextSibling;
			RunLoadStorePropagation(ctx, module, curr);
			curr = next;
		}

		// Remove allocas that are only used by stores
		for(unsigned i = 0; i < function->allocas.size(); i++)
		{
			VariableData *variable = function->allocas[i];

			bool nonStoreUse = false;

			for(unsigned k = 0; k < variable->users.size(); k++)
			{
				VmConstant *user = variable->users[k];

				for(unsigned l = 0; l < user->users.size(); l++)
				{
					if(VmInstruction *inst = getType<VmInstruction>(user->users[l]))
					{
						if(inst->cmd >= VM_INST_STORE_BYTE && inst->cmd <= VM_INST_STORE_STRUCT && inst->arguments[0] == user)
							continue;

						if(inst->cmd == VM_INST_MEM_COPY && inst->arguments[0] == user)
							continue;

						if(inst->cmd == VM_INST_MEM_COPY && inst->arguments[2] == user)
						{
							if(VmConstant *dst = getType<VmConstant>(inst->arguments[0]))
							{
								// Copy to the same container the load is from is a circular use and doesn't count as non-store use
								if(dst->container == user->container)
									continue;
							}
						}

						if(inst->cmd == VM_INST_SET_RANGE && inst->arguments[0] == user)
							continue;

						nonStoreUse = true;
						break;
					}
					else
					{
						assert(!"invalid constant use");
					}
				}

				if(nonStoreUse)
					break;
			}

			if(!nonStoreUse)
			{
				SmallArray<VmInstruction*, 32> deadStores(module->allocator);

				for(unsigned k = 0; k < variable->users.size(); k++)
				{
					VmConstant *user = variable->users[k];

					for(unsigned l = 0; l < user->users.size(); l++)
					{
						if(VmInstruction *inst = getType<VmInstruction>(user->users[l]))
							deadStores.push_back(inst);
					}
				}

				for(unsigned k = 0; k < deadStores.size(); k++)
				{
					VmInstruction *inst = deadStores[k];

					if(inst->parent)
						inst->parent->RemoveInstruction(inst);

					module->loadStorePropagations++;
				}
			}
		}

		module->currentFunction = NULL;
	}
	else if(VmBlock *block = getType<VmBlock>(value))
	{
		// Handle loads and stores to constant global or frame addresses
		ClearLoadStoreInfo(module);

		for(VmInstruction *curr = block->firstInstruction; curr;)
		{
			VmInstruction *next = curr->nextSibling;

			switch(curr->cmd)
			{
			case VM_INST_LOAD_BYTE:
				if(VmValue* prevValue = GetLoadStoreInfo(module, curr))
				{
					if(VmConstant* constant = getType<VmConstant>(prevValue))
					{
						ReplaceValueUsersWith(module, curr, CreateConstantInt(module->allocator, prevValue->source, (int)(char)(constant->iValue)), &module->loadStorePropagations);
						break;
					}
				}

				AddLoadInfo(module, curr);
				break;
			case VM_INST_LOAD_SHORT:
				if(VmValue* prevValue = GetLoadStoreInfo(module, curr))
				{
					if(VmConstant* constant = getType<VmConstant>(prevValue))
					{
						ReplaceValueUsersWith(module, curr, CreateConstantInt(module->allocator, prevValue->source, (int)(short)(constant->iValue)), &module->loadStorePropagations);
						break;
					}
				}

				AddLoadInfo(module, curr);
				break;
			case VM_INST_LOAD_INT:
			case VM_INST_LOAD_FLOAT:
			case VM_INST_LOAD_DOUBLE:
			case VM_INST_LOAD_LONG:
			case VM_INST_LOAD_STRUCT:
				if(VmValue* prevValue = GetLoadStoreInfo(module, curr))
				{
					if(curr->type != prevValue->type)
					{
						assert(curr->type.size == prevValue->type.size);

						module->currentBlock = block;

						block->insertPoint = curr->prevSibling;

						prevValue = CreateBitcast(module, curr->source, curr->type, prevValue);

						block->insertPoint = block->lastInstruction;

						module->currentBlock = NULL;

						ReplaceValueUsersWith(module, curr, prevValue, &module->loadStorePropagations);
					}
					else
					{
						ReplaceValueUsersWith(module, curr, prevValue, &module->loadStorePropagations);
					}

					break;
				}

				AddLoadInfo(module, curr);
				break;
			case VM_INST_STORE_BYTE:
			case VM_INST_STORE_SHORT:
			case VM_INST_STORE_INT:
			case VM_INST_STORE_FLOAT:
			case VM_INST_STORE_DOUBLE:
			case VM_INST_STORE_LONG:
			case VM_INST_STORE_STRUCT:
				AddStoreInfo(module, curr);
				break;
			case VM_INST_MEM_COPY:
				{
					VmValue *address = curr->arguments[2];
					VmConstant *offset = getType<VmConstant>(curr->arguments[3]);

					if(VmInstruction* prevCopy = GetCopyInfo(module, address, offset, GetAccessSize(curr)))
					{
						ChangeInstructionTo(module, curr, curr->cmd, curr->arguments[0], curr->arguments[1], prevCopy->arguments[2], prevCopy->arguments[3], curr->arguments[4], &module->loadStorePropagations);
					}
				}

				AddCopyInfo(module, curr);
				break;
			case VM_INST_SET_RANGE:
				ClearLoadStoreInfoAliasing(module, NULL);
				ClearLoadStoreInfoGlobal(module);
				break;
			case VM_INST_CALL:
				unsigned firstArgument;
				VmFunction *targetFunction;

				if(curr->arguments[0]->type.type == VM_TYPE_FUNCTION_REF)
				{
					firstArgument = 2;

					targetFunction = NULL;
				}
				else
				{
					firstArgument = 3;

					targetFunction = getType<VmFunction>(curr->arguments[1]);
				}

				for(unsigned i = firstArgument; i < curr->arguments.size(); i++)
				{
					if(VmConstant *constant = getType<VmConstant>(curr->arguments[i]))
					{
						if(constant->isReference)
						{
							if(VmInstruction* prevCopy = GetCopyInfo(module, constant, NULL, constant->type.size))
							{
								if(VmConstant *constAddress = getType<VmConstant>(prevCopy->arguments[2]))
								{
									VmConstant *reference = new (module->get<VmConstant>()) VmConstant(ctx.allocator, constant->type, curr->source);

									reference->iValue = constAddress->iValue;
									reference->container = constAddress->container;
									reference->isReference = true;

									reference->container->users.push_back(reference);

									reference->comment = constant->comment;

									reference->AddUse(curr);
									curr->arguments[i]->RemoveUse(curr);

									curr->arguments[i] = reference;
								}
							}
						}
					}
				}

				if(VmConstant *constant = getType<VmConstant>(curr->arguments[firstArgument - 1]))
				{
					if(constant->isReference)
					{
						// Remove previous loads and stores to the address range of the return value
						ClearLoadStoreInfo(module, constant->container, unsigned(constant->iValue), constant->type.size);
					}
				}

				if(targetFunction)
				{
					if((targetFunction->function->attributes & (1 << NULLC_ATTRIBUTE_NO_MEMORY_WRITE)) != 0)
						break;
				}

				ClearLoadStoreInfoAliasing(module, NULL);
				ClearLoadStoreInfoGlobal(module);
				break;
			case VM_INST_RETURN:
				if(!curr->arguments.empty())
				{
					if(VmConstant *constant = getType<VmConstant>(curr->arguments[0]))
					{
						if(constant->isReference)
						{
							if(VmInstruction* prevCopy = GetCopyInfo(module, constant, NULL, constant->type.size))
							{
								if(VmConstant *constAddress = getType<VmConstant>(prevCopy->arguments[2]))
								{
									VmConstant *reference = new (module->get<VmConstant>()) VmConstant(ctx.allocator, constant->type, curr->source);

									reference->iValue = constAddress->iValue;
									reference->container = constAddress->container;
									reference->isReference = true;

									reference->container->users.push_back(reference);

									ChangeInstructionTo(module, curr, curr->cmd, reference, NULL, NULL, NULL, NULL, &module->loadStorePropagations);
								}
							}
						}
					}
				}
				break;
			case VM_INST_ADD_LOAD:
			case VM_INST_SUB_LOAD:
			case VM_INST_MUL_LOAD:
			case VM_INST_DIV_LOAD:
			case VM_INST_POW_LOAD:
			case VM_INST_MOD_LOAD:
			case VM_INST_LESS_LOAD:
			case VM_INST_GREATER_LOAD:
			case VM_INST_LESS_EQUAL_LOAD:
			case VM_INST_GREATER_EQUAL_LOAD:
			case VM_INST_EQUAL_LOAD:
			case VM_INST_NOT_EQUAL_LOAD:
			case VM_INST_SHL_LOAD:
			case VM_INST_SHR_LOAD:
			case VM_INST_BIT_AND_LOAD:
			case VM_INST_BIT_OR_LOAD:
			case VM_INST_BIT_XOR_LOAD:
			{
				VmValue *loadPointer = curr->arguments[1];
				VmConstant *loadOffset = getType<VmConstant>(curr->arguments[2]);
				VmConstant *loadInst = getType<VmConstant>(curr->arguments[3]);

				unsigned loadSize = 0;

				switch(loadInst->iValue)
				{
				case VM_INST_LOAD_INT:
				case VM_INST_LOAD_FLOAT:
					loadSize = 4;
					break;
				case VM_INST_LOAD_DOUBLE:
				case VM_INST_LOAD_LONG:
					loadSize = 8;
					break;
				}

				assert(loadSize);

				unsigned accessSize = GetAccessSize(curr);

				if(VmValue* prevValue = GetLoadStoreInfo(module, loadPointer, loadOffset, loadSize, accessSize, VmInstructionType(loadInst->iValue)))
					ChangeInstructionTo(module, curr, GetOperationWithoutLoad(curr->cmd), curr->arguments[0], prevValue, NULL, NULL, NULL, &module->loadStorePropagations);
			}
				break;
			default:
				break;
			}

			curr = next;
		}

		// Handle consecutive stores to the same address
		for(VmInstruction *curr = block->firstInstruction; curr; curr = curr->nextSibling)
		{
			if(curr->cmd >= VM_INST_STORE_BYTE && curr->cmd <= VM_INST_STORE_STRUCT)
			{
				// Walk up until a memory write is reached
				VmInstruction *prev = curr->prevSibling;

				while(prev && !HasMemoryAccess(prev->cmd))
					prev = prev->prevSibling;

				if(prev && prev->cmd == curr->cmd)
				{
					bool same = false;

					VmConstant *prevAddressAsConst = getType<VmConstant>(prev->arguments[0]);
					VmConstant *prevOffset = getType<VmConstant>(prev->arguments[1]);

					VmConstant *currAddressAsConst = getType<VmConstant>(curr->arguments[0]);
					VmConstant *currOffset = getType<VmConstant>(curr->arguments[1]);

					if(currAddressAsConst && prevAddressAsConst)
						same = *currAddressAsConst == *prevAddressAsConst && prevOffset->iValue == currOffset->iValue;
					else
						same = prev->arguments[0] == curr->arguments[0] && prevOffset->iValue == currOffset->iValue;

					if(same)
					{
						block->RemoveInstruction(prev);

						module->loadStorePropagations++;
					}
				}
			}
		}

		// Handle immediate loads from the same address as a store
		for(VmInstruction *curr = block->firstInstruction; curr;)
		{
			VmInstruction *next = curr->nextSibling;

			if(curr->cmd >= VM_INST_LOAD_INT && curr->cmd <= VM_INST_LOAD_STRUCT)
			{
				VmValue *loadPointer = curr->arguments[0];
				VmConstant *loadOffset = getType<VmConstant>(curr->arguments[1]);

				// Skip reads of direct addresses (usually from null pointer access)
				if(VmConstant *loadAddress = getType<VmConstant>(loadPointer))
				{
					if(!loadAddress->container)
					{
						curr = next;
						continue;
					}
				}

				// Walk up until a memory write is reached
				VmInstruction *prev = curr->prevSibling;

				while(prev && !HasMemoryAccess(prev->cmd))
					prev = prev->prevSibling;

				if(prev && (prev->cmd >= VM_INST_STORE_INT && prev->cmd <= VM_INST_STORE_STRUCT))
				{
					VmValue *storePointer = prev->arguments[0];
					VmConstant *storeOffset = getType<VmConstant>(prev->arguments[1]);
					VmValue *storeValue = prev->arguments[2];

					if(GetAccessSize(prev) == GetAccessSize(curr) && storePointer == loadPointer && storeOffset->iValue == loadOffset->iValue && curr->type.size == storeValue->type.size)
					{
						if(curr->type != storeValue->type)
						{
							module->currentBlock = block;

							block->insertPoint = curr->prevSibling;

							storeValue = CreateBitcast(module, curr->source, curr->type, storeValue);

							block->insertPoint = block->lastInstruction;

							module->currentBlock = NULL;

							ReplaceValueUsersWith(module, curr, storeValue, &module->loadStorePropagations);
						}
						else
						{
							ReplaceValueUsersWith(module, curr, storeValue, &module->loadStorePropagations);
						}
					}
				}
			}

			curr = next;
		}
	}
}